

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O0

void __thiscall sznet::net::Connector::handleError(Connector *this)

{
  LogLevel LVar1;
  LogStream *pLVar2;
  self *psVar3;
  char *str;
  SourceFile file;
  SourceFile file_00;
  undefined1 local_1fe8 [12];
  Logger local_1fd8;
  int local_1004;
  sz_sock local_1000;
  int err;
  sz_sock sockfd;
  undefined1 local_ff0 [12];
  Logger local_fe0;
  Connector *local_10;
  Connector *this_local;
  
  local_10 = this;
  Logger::SourceFile::SourceFile<100>
            ((SourceFile *)local_ff0,
             (char (*) [100])
             "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/Connector.cpp"
            );
  file._12_4_ = 0;
  file.m_data = (char *)local_ff0._0_8_;
  file.m_size = local_ff0._8_4_;
  Logger::Logger(&local_fe0,file,0xcc,ERROR);
  pLVar2 = Logger::stream(&local_fe0);
  psVar3 = LogStream::operator<<(pLVar2,"Connector::handleError state=");
  LogStream::operator<<(psVar3,this->m_state);
  Logger::~Logger(&local_fe0);
  if (this->m_state == kConnecting) {
    local_1000 = removeAndResetChannel(this);
    local_1004 = sockets::sz_sock_geterror(local_1000);
    LVar1 = Logger::logLevel();
    if ((int)LVar1 < 1) {
      Logger::SourceFile::SourceFile<100>
                ((SourceFile *)local_1fe8,
                 (char (*) [100])
                 "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/Connector.cpp"
                );
      file_00._12_4_ = 0;
      file_00.m_data = (char *)local_1fe8._0_8_;
      file_00.m_size = local_1fe8._8_4_;
      Logger::Logger(&local_1fd8,file_00,0xd1,TRACE,"handleError");
      pLVar2 = Logger::stream(&local_1fd8);
      psVar3 = LogStream::operator<<(pLVar2,"SO_ERROR = ");
      pLVar2 = LogStream::operator<<(psVar3,local_1004);
      psVar3 = LogStream::operator<<(pLVar2," ");
      str = sz_strerror_tl(local_1004);
      LogStream::operator<<(psVar3,str);
      Logger::~Logger(&local_1fd8);
    }
    retry(this,local_1000);
  }
  return;
}

Assistant:

void Connector::handleError()
{
	LOG_ERROR << "Connector::handleError state=" << m_state;
	if (m_state == kConnecting)
	{
		sockets::sz_sock sockfd = removeAndResetChannel();
		int err = sockets::sz_sock_geterror(sockfd);
		LOG_TRACE << "SO_ERROR = " << err << " " << sz_strerror_tl(err);
		retry(sockfd);
	}
}